

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenu::setDefaultAction(QMenu *this,QAction *act)

{
  long lVar1;
  int *piVar2;
  undefined8 uVar3;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (act == (QAction *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)act);
  }
  piVar2 = *(int **)(lVar1 + 0x398);
  *(undefined8 *)(lVar1 + 0x398) = uVar3;
  *(QAction **)(lVar1 + 0x3a0) = act;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
      return;
    }
  }
  return;
}

Assistant:

void QMenu::setDefaultAction(QAction *act)
{
    d_func()->defaultAction = act;
}